

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::yarn5s>(yarn5s *r1,yarn5s *r2,long N,long skip1,long skip2)

{
  long in_RCX;
  yarn5s *in_RDI;
  long in_R8;
  long in_R9;
  long j_1;
  long j;
  long i;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  result_type in_stack_ffffffffffffff58;
  result_type in_stack_ffffffffffffff5c;
  yarn5s *this;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  long local_88;
  size_type in_stack_ffffffffffffff88;
  long lVar1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  
  this = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2c7d5b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2c7d65);
  if (0 < in_RCX) {
    std::vector<int,_std::allocator<int>_>::reserve
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::vector<int,_std::allocator<int>_>::reserve
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  for (lVar1 = 0; lVar1 < in_RCX; lVar1 = lVar1 + 1) {
    in_stack_ffffffffffffff5c = trng::yarn5s::operator()(this);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
              );
    in_stack_ffffffffffffff58 = trng::yarn5s::operator()(this);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
              );
    for (local_88 = 0; local_88 < in_R8; local_88 = local_88 + 1) {
      trng::yarn5s::operator()(this);
    }
    for (in_stack_ffffffffffffff70 = (vector<int,_std::allocator<int>_> *)0x0;
        (long)in_stack_ffffffffffffff70 < in_R9;
        in_stack_ffffffffffffff70 =
             (vector<int,_std::allocator<int>_> *)
             ((long)&(in_stack_ffffffffffffff70->super__Vector_base<int,_std::allocator<int>_>).
                     _M_impl.super__Vector_impl_data._M_start + 1)) {
      trng::yarn5s::operator()(this);
    }
  }
  std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>::
  tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
            ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
              *)this,(vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (vector<int,_std::allocator<int>_> *)0x2c7ecb);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff70);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff70);
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         in_RDI;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}